

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void google::protobuf::
     SplitStringToIteratorUsing<std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
               (StringPiece full,char *delim,
               back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *result)

{
  char cVar1;
  char *pcVar2;
  stringpiece_ssize_type sVar3;
  char *pcVar4;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RCX;
  char *in_RDX;
  bool bVar5;
  size_type end_index;
  size_type begin_index;
  char *start;
  char *end;
  char *p;
  char c;
  value_type *in_stack_fffffffffffffe78;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffe80;
  size_type in_stack_fffffffffffffe88;
  StringPiece *in_stack_fffffffffffffe90;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_120;
  StringPiece local_118;
  string local_108 [32];
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e8;
  StringPiece local_e0;
  string local_d0 [64];
  stringpiece_ssize_type local_90;
  long local_88;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80 [2];
  size_type in_stack_ffffffffffffff90;
  StringPiece *in_stack_ffffffffffffff98;
  StringPiece in_stack_ffffffffffffffa0;
  char *local_30;
  StringPiece local_10;
  
  if ((*in_RDX == '\0') || (in_RDX[1] != '\0')) {
    StringPiece::StringPiece
              ((StringPiece *)in_stack_fffffffffffffe80.container,(char *)in_stack_fffffffffffffe78)
    ;
    local_88 = StringPiece::find_first_not_of
                         (in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,
                          in_stack_ffffffffffffff90);
    while (local_88 != -1) {
      StringPiece::StringPiece
                ((StringPiece *)in_stack_fffffffffffffe80.container,
                 (char *)in_stack_fffffffffffffe78);
      local_90 = StringPiece::find_first_of
                           (in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,
                            in_stack_ffffffffffffff90);
      if (local_90 == -1) {
        local_e0 = StringPiece::substr(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                                       (size_type)in_stack_fffffffffffffe80.container);
        StringPiece::operator_cast_to_string((StringPiece *)in_stack_fffffffffffffe78);
        local_e8 = std::
                   back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator++(in_RCX,0);
        std::
        back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&local_e8);
        std::
        back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator=((back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffffe80.container,in_stack_fffffffffffffe78);
        std::__cxx11::string::~string(local_d0);
        return;
      }
      local_118 = StringPiece::substr(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                                      (size_type)in_stack_fffffffffffffe80.container);
      StringPiece::operator_cast_to_string((StringPiece *)in_stack_fffffffffffffe78);
      in_stack_fffffffffffffe80 =
           std::
           back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator++(in_RCX,0);
      local_120 = in_stack_fffffffffffffe80;
      in_stack_fffffffffffffe78 =
           (value_type *)
           std::
           back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_120);
      std::
      back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator=((back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffe80.container,in_stack_fffffffffffffe78);
      std::__cxx11::string::~string(local_108);
      StringPiece::StringPiece
                ((StringPiece *)in_stack_fffffffffffffe80.container,
                 (char *)in_stack_fffffffffffffe78);
      local_88 = StringPiece::find_first_not_of
                           (in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,
                            in_stack_ffffffffffffff90);
    }
  }
  else {
    cVar1 = *in_RDX;
    local_30 = StringPiece::data(&local_10);
    sVar3 = StringPiece::size(&local_10);
    pcVar4 = local_30 + sVar3;
    while (pcVar2 = local_30, local_30 != pcVar4) {
      if (*local_30 == cVar1) {
        local_30 = local_30 + 1;
      }
      else {
        do {
          local_30 = local_30 + 1;
          bVar5 = false;
          if (local_30 != pcVar4) {
            bVar5 = *local_30 != cVar1;
          }
        } while (bVar5);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffffa0,pcVar2,(long)local_30 - (long)pcVar2,
                   (allocator *)&stack0xffffffffffffff9f);
        local_80[0] = std::
                      back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++(in_RCX,0);
        std::
        back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(local_80);
        std::
        back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator=((back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffffe80.container,in_stack_fffffffffffffe78);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
      }
    }
  }
  return;
}

Assistant:

static inline void SplitStringToIteratorUsing(StringPiece full,
                                              const char *delim, ITR &result) {
  // Optimize the common case where delim is a single character.
  if (delim[0] != '\0' && delim[1] == '\0') {
    char c = delim[0];
    const char* p = full.data();
    const char* end = p + full.size();
    while (p != end) {
      if (*p == c) {
        ++p;
      } else {
        const char* start = p;
        while (++p != end && *p != c);
        *result++ = std::string(start, p - start);
      }
    }
    return;
  }

  std::string::size_type begin_index, end_index;
  begin_index = full.find_first_not_of(delim);
  while (begin_index != std::string::npos) {
    end_index = full.find_first_of(delim, begin_index);
    if (end_index == std::string::npos) {
      *result++ = std::string(full.substr(begin_index));
      return;
    }
    *result++ =
        std::string(full.substr(begin_index, (end_index - begin_index)));
    begin_index = full.find_first_not_of(delim, end_index);
  }
}